

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncmp.c
# Opt level: O3

int strncmp(char *__s1,char *__s2,size_t __n)

{
  byte bVar1;
  size_t sVar2;
  
  if (__n != 0) {
    sVar2 = 0;
    do {
      bVar1 = __s1[sVar2];
      if ((bVar1 == 0) || (bVar1 != __s2[sVar2])) {
        return (uint)bVar1 - (uint)(byte)__s2[sVar2];
      }
      sVar2 = sVar2 + 1;
    } while (__n != sVar2);
  }
  return 0;
}

Assistant:

int strncmp( const char * s1, const char * s2, size_t n )
{
    while ( n && *s1 && ( *s1 == *s2 ) )
    {
        ++s1;
        ++s2;
        --n;
    }

    if ( n == 0 )
    {
        return 0;
    }
    else
    {
        return ( *( unsigned char * )s1 - * ( unsigned char * )s2 );
    }
}